

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedHandler::AnnotatedHandler
          (AnnotatedHandler *this,JsonCodec *codec,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  Maybe<kj::StringPtr> *this_00;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::json::DiscriminatorOptions::Reader>_2 *this_01;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ArrayPtr<const_char> AVar4;
  StringPtr key;
  Reader typeName;
  Reader anno;
  Reader schemaProto;
  Schema local_1d0;
  Reader local_1c8;
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_190;
  ArrayPtr<const_char> local_180;
  FieldList local_170;
  Reader local_138;
  undefined1 local_118 [48];
  Reader local_e8;
  Mapper<capnp::StructSchema::FieldList> local_b8;
  FieldNameInfo local_80;
  FieldNameInfo local_58;
  
  (this->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_002754c0;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  (this->fields).ptr = (FieldInfo *)0x0;
  (this->fields).size_ = 0;
  (this->fields).disposer = (ArrayDisposer *)0x0;
  (this->fieldsByName).table.rows.builder.ptr = (Entry *)0x0;
  (this->fieldsByName).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
        *)0x0;
  (this->fieldsByName).table.rows.builder.endPtr = (Entry *)0x0;
  (this->fieldsByName).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->fieldsByName).table.indexes.erasedCount = 0;
  (this->fieldsByName).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->fieldsByName).table.indexes.buckets.size_ = 0;
  (this->fieldsByName).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unionTagValues).table.rows.builder.ptr = (Entry *)0x0;
  (this->unionTagValues).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)0x0;
  (this->unionTagValues).table.rows.builder.endPtr = (Entry *)0x0;
  (this->unionTagValues).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->unionTagValues).table.indexes.erasedCount = 0;
  (this->unionTagValues).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->unionTagValues).table.indexes.buckets.size_ = 0;
  (this->unionTagValues).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unionTagName).ptr.isSet = false;
  local_1d0 = schema.super_Schema.raw;
  Schema::getProto(&local_e8,&local_1d0);
  local_180 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_e8);
  bVar1 = (discriminator->ptr).isSet;
  if ((bool)bVar1 == false) {
    capnp::schema::Node::Reader::getAnnotations((Reader *)&local_b8,&local_e8);
    local_190.container = (Reader *)&local_b8;
    for (local_190.index = 0; local_190.index != (uint)local_b8.array.list.reader.ptr;
        local_190.index = local_190.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator*((Reader *)&local_170,&local_190);
      if ((0x3f < local_170.list.reader.elementCount) &&
         ((local_170.list.reader.capTable)->_vptr_CapTableReader == (_func_int **)0xcfa794e8d19a0162
         )) {
        capnp::schema::Annotation::Reader::getValue(&local_1c8,(Reader *)&local_170);
        local_138.reader.nestingLimit = local_1c8._reader.nestingLimit;
        local_138.reader.pointer = local_1c8._reader.pointers;
        if (local_1c8._reader.pointerCount == 0) {
          local_138.reader.pointer = (WirePointer *)0x0;
          local_138.reader.nestingLimit = 0x7fffffff;
        }
        local_138.reader.segment._0_4_ = 0;
        local_138.reader.segment._4_4_ = 0;
        local_138.reader.capTable._0_4_ = 0;
        local_138.reader.capTable._4_4_ = 0;
        if (local_1c8._reader.pointerCount != 0) {
          local_138.reader.segment._0_4_ = local_1c8._reader.segment._0_4_;
          local_138.reader.segment._4_4_ = local_1c8._reader.segment._4_4_;
          local_138.reader.capTable._0_4_ = local_1c8._reader.capTable._0_4_;
          local_138.reader.capTable._4_4_ = local_1c8._reader.capTable._4_4_;
        }
        AnyPointer::Reader::getAs<capnp::json::DiscriminatorOptions>
                  ((ReaderFor<capnp::json::DiscriminatorOptions> *)local_118,&local_138);
        if ((discriminator->ptr).isSet == true) {
          (discriminator->ptr).isSet = false;
        }
        *(undefined4 *)((long)&(discriminator->ptr).field_1 + 0x20) = local_118._32_4_;
        *(undefined2 *)((long)&(discriminator->ptr).field_1 + 0x24) = local_118._36_2_;
        *(undefined2 *)((long)&(discriminator->ptr).field_1 + 0x26) = local_118._38_2_;
        *(undefined8 *)&(discriminator->ptr).field_1.value._reader.nestingLimit = local_118._40_8_;
        (discriminator->ptr).field_1.value._reader.data = (void *)local_118._16_8_;
        (discriminator->ptr).field_1.value._reader.pointers = (WirePointer *)local_118._24_8_;
        (discriminator->ptr).field_1.value._reader.segment = (SegmentReader *)local_118._0_8_;
        (discriminator->ptr).field_1.value._reader.capTable = (CapTableReader *)local_118._8_8_;
        (discriminator->ptr).isSet = true;
      }
    }
    bVar1 = (discriminator->ptr).isSet;
  }
  if ((bVar1 & 1) == 0) goto LAB_0016ef82;
  this_01 = &(discriminator->ptr).field_1;
  bVar2 = json::DiscriminatorOptions::Reader::hasName(&this_01->value);
  this_00 = &this->unionTagName;
  if (bVar2) {
    AVar4 = (ArrayPtr<const_char>)json::DiscriminatorOptions::Reader::getName(&this_01->value);
    if ((this_00->ptr).isSet == true) {
      (this_00->ptr).isSet = false;
    }
    (this->unionTagName).ptr.field_1.value.content = AVar4;
    (this->unionTagName).ptr.isSet = true;
LAB_0016eeea:
    local_58.type = UNION_TAG;
    local_58.index = 0;
    local_58.prefixLength = 0;
    local_58.ownName.content.ptr = (char *)0x0;
    local_58.ownName.content.size_ = 0;
    local_58.ownName.content.disposer = (ArrayDisposer *)0x0;
    kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
              (&this->fieldsByName,(StringPtr)(this->unionTagName).ptr.field_1.value.content,
               &local_58);
    kj::Array<char>::~Array(&local_58.ownName.content);
  }
  else {
    kj::_::NullableValue<kj::StringPtr>::operator=(&this_00->ptr,&unionDeclName->ptr);
    if (((this_00->ptr).isSet & 1U) != 0) goto LAB_0016eeea;
  }
  bVar2 = json::DiscriminatorOptions::Reader::hasValueName(&this_01->value);
  if (bVar2) {
    key.content = (ArrayPtr<const_char>)
                  json::DiscriminatorOptions::Reader::getValueName(&this_01->value);
    local_80.type = UNION_VALUE;
    local_80.index = 0;
    local_80.prefixLength = 0;
    local_80.ownName.content.ptr = (char *)0x0;
    local_80.ownName.content.size_ = 0;
    local_80.ownName.content.disposer = (ArrayDisposer *)0x0;
    kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
              (&this->fieldsByName,key,&local_80);
    kj::Array<char>::~Array(&local_80.ownName.content);
  }
LAB_0016ef82:
  uVar3 = 0;
  if (0x11f < local_e8._reader.dataSize) {
    uVar3 = *(uint *)((long)local_e8._reader.data + 0x20);
  }
  this->discriminantOffset = uVar3;
  StructSchema::getFields(&local_170,(StructSchema *)&local_1d0);
  local_b8.array.list.reader.nestingLimit = local_170.list.reader.nestingLimit;
  local_b8.array.list.reader._44_4_ = local_170.list.reader._44_4_;
  local_b8.array.list.reader.structDataSize = local_170.list.reader.structDataSize;
  local_b8.array.list.reader.structPointerCount = local_170.list.reader.structPointerCount;
  local_b8.array.list.reader.elementSize = local_170.list.reader.elementSize;
  local_b8.array.list.reader._39_1_ = local_170.list.reader._39_1_;
  local_b8.array.list.reader.capTable = local_170.list.reader.capTable;
  local_b8.array.list.reader.ptr = local_170.list.reader.ptr;
  local_b8.array.parent.super_Schema.raw = local_170.parent.super_Schema.raw;
  local_b8.array.list.reader.segment = local_170.list.reader.segment;
  local_118._0_8_ = &local_180;
  local_118._8_8_ = codec;
  local_118._16_8_ = dependencies;
  local_118._24_8_ = this;
  local_118._32_8_ = discriminator;
  kj::_::Mapper<capnp::StructSchema::FieldList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:990:14)>
            ((Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *)&local_1c8,&local_b8,
             (anon_class_40_5_590b9dd2 *)local_118);
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::operator=
            (&this->fields,(Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *)&local_1c8);
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~Array
            ((Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *)&local_1c8);
  return;
}

Assistant:

AnnotatedHandler(JsonCodec& codec, StructSchema schema,
                   kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
                   kj::Maybe<kj::StringPtr> unionDeclName,
                   kj::Vector<Schema>& dependencies)
      : schema(schema) {
    auto schemaProto = schema.getProto();
    auto typeName = schemaProto.getDisplayName();

    if (discriminator == kj::none) {
      // There are two cases of unions:
      // * Named unions, which are special cases of named groups. In this case, the union may be
      //   annotated by annotating the field. In this case, we receive a non-null `discriminator`
      //   as a constructor parameter, and schemaProto.getAnnotations() must be empty because
      //   it's not possible to annotate a group's type (because the type is anonymous).
      // * Unnamed unions, of which there can only be one in any particular scope. In this case,
      //   the parent struct type itself is annotated.
      // So if we received `null` as the constructor parameter, check for annotations on the struct
      // type.
      for (auto anno: schemaProto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            discriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
        }
      }
    }

    KJ_IF_SOME(d, discriminator) {
      if (d.hasName()) {
        unionTagName = d.getName();
      } else {
        unionTagName = unionDeclName;
      }
      KJ_IF_SOME(u, unionTagName) {
        fieldsByName.insert(u, FieldNameInfo {
          FieldNameInfo::UNION_TAG, 0, 0, nullptr
        });
      }

      if (d.hasValueName()) {
        fieldsByName.insert(d.getValueName(), FieldNameInfo {
          FieldNameInfo::UNION_VALUE, 0, 0, nullptr
        });
      }
    }

    discriminantOffset = schemaProto.getStruct().getDiscriminantOffset();

    fields = KJ_MAP(field, schema.getFields()) {
      auto fieldProto = field.getProto();
      auto type = field.getType();
      auto fieldName = fieldProto.getName();

      FieldNameInfo nameInfo;
      nameInfo.index = field.getIndex();
      nameInfo.type = FieldNameInfo::NORMAL;
      nameInfo.prefixLength = 0;

      FieldInfo info;
      info.name = fieldName;

      kj::Maybe<json::DiscriminatorOptions::Reader> subDiscriminator;
      bool flattened = false;
      for (auto anno: field.getProto().getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            info.name = anno.getValue().getText();
            break;
          case JSON_FLATTEN_ANNOTATION_ID:
            KJ_REQUIRE(type.isStruct(), "only struct types can be flattened", fieldName, typeName);
            flattened = true;
            info.prefix = anno.getValue().getStruct().getAs<json::FlattenOptions>().getPrefix();
            break;
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            KJ_REQUIRE(fieldProto.isGroup(), "only unions can have discriminator");
            subDiscriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
          case JSON_BASE64_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for base64 encoding");
            static Base64Handler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
          case JSON_HEX_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for hex encoding");
            static HexHandler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
        }
      }

      if (fieldProto.isGroup()) {
        // Load group type handler now, even if not flattened, so that we can pass its
        // `subDiscriminator`.
        kj::Maybe<kj::StringPtr> subFieldName;
        if (flattened) {
          // If the group was flattened, then we allow its field name to be used as the
          // discriminator name, so that the discriminator doesn't have to explicitly specify a
          // name.
          subFieldName = fieldName;
        }
        auto& subHandler = codec.loadAnnotatedHandler(
            type.asStruct(), subDiscriminator, subFieldName, dependencies);
        if (flattened) {
          info.flattenHandler = subHandler;
        }
      } else if (type.isStruct()) {
        if (flattened) {
          info.flattenHandler = codec.loadAnnotatedHandler(
              type.asStruct(), kj::none, kj::none, dependencies);
        }
      }

      bool isUnionMember = fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT;

      KJ_IF_SOME(fh, info.flattenHandler) {
        // Set up fieldsByName for each of the child's fields.
        for (auto& entry: fh.fieldsByName) {
          kj::StringPtr flattenedName;
          kj::String ownName;
          if (info.prefix.size() > 0) {
            ownName = kj::str(info.prefix, entry.key);
            flattenedName = ownName;
          } else {
            flattenedName = entry.key;
          }

          fieldsByName.upsert(flattenedName, FieldNameInfo {
            isUnionMember ? FieldNameInfo::FLATTENED_FROM_UNION : FieldNameInfo::FLATTENED,
            field.getIndex(), (uint)info.prefix.size(), kj::mv(ownName)
          }, [&](FieldNameInfo& existing, FieldNameInfo&& replacement) {
            KJ_REQUIRE(existing.type == FieldNameInfo::FLATTENED_FROM_UNION &&
                       replacement.type == FieldNameInfo::FLATTENED_FROM_UNION,
                "flattened members have the same name and are not mutually exclusive");
          });
        }
      }

      info.nameForDiscriminant = info.name;

      if (!flattened) {
        bool isUnionWithValueName = false;
        if (isUnionMember) {
          KJ_IF_SOME(d, discriminator) {
            if (d.hasValueName()) {
              info.name = d.getValueName();
              isUnionWithValueName = true;
            }
          }
        }

        if (!isUnionWithValueName) {
          fieldsByName.insert(info.name, kj::mv(nameInfo));
        }
      }

      if (isUnionMember) {
        unionTagValues.insert(info.nameForDiscriminant, field);
      }

      // Look for dependencies that we need to add.
      while (type.isList()) type = type.asList().getElementType();
      if (codec.impl->typeHandlers.find(type) == kj::none) {
        switch (type.which()) {
          case schema::Type::STRUCT:
            dependencies.add(type.asStruct());
            break;
          case schema::Type::ENUM:
            dependencies.add(type.asEnum());
            break;
          case schema::Type::INTERFACE:
            dependencies.add(type.asInterface());
            break;
          default:
            break;
        }
      }

      return info;
    };
  }